

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_update_ad(mbedtls_cipher_context_t *ctx,uchar *ad,size_t ad_len)

{
  mbedtls_chachapoly_mode_t mode;
  int result;
  size_t ad_len_local;
  uchar *ad_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
    ctx_local._4_4_ =
         mbedtls_gcm_starts((mbedtls_gcm_context *)ctx->cipher_ctx,ctx->operation,ctx->iv,
                            ctx->iv_size,ad,ad_len);
  }
  else if (ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) {
    ctx_local._4_4_ =
         mbedtls_chachapoly_starts
                   ((mbedtls_chachapoly_context *)ctx->cipher_ctx,ctx->iv,
                    (uint)(ctx->operation != MBEDTLS_ENCRYPT));
    if (ctx_local._4_4_ == 0) {
      ctx_local._4_4_ =
           mbedtls_chachapoly_update_aad((mbedtls_chachapoly_context *)ctx->cipher_ctx,ad,ad_len);
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_update_ad( mbedtls_cipher_context_t *ctx,
                      const unsigned char *ad, size_t ad_len )
{
    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( ad_len == 0 || ad != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        return( mbedtls_gcm_starts( (mbedtls_gcm_context *) ctx->cipher_ctx, ctx->operation,
                                    ctx->iv, ctx->iv_size, ad, ad_len ) );
    }
#endif

#if defined(MBEDTLS_CHACHAPOLY_C)
    if (MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        int result;
        mbedtls_chachapoly_mode_t mode;

        mode = ( ctx->operation == MBEDTLS_ENCRYPT )
                ? MBEDTLS_CHACHAPOLY_ENCRYPT
                : MBEDTLS_CHACHAPOLY_DECRYPT;

        result = mbedtls_chachapoly_starts( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                                        ctx->iv,
                                                        mode );
        if ( result != 0 )
            return( result );

        return( mbedtls_chachapoly_update_aad( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                               ad, ad_len ) );
    }
#endif

    return( 0 );
}